

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterStartCDATA(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xmlLinkPtr lk;
  void *pvVar4;
  undefined8 *data;
  char *msg;
  int iVar5;
  xmlParserErrors error;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    return -1;
  }
  lk = xmlListFront(writer->nodes);
  iVar3 = 0;
  iVar5 = -1;
  if ((lk != (xmlLinkPtr)0x0) && (pvVar4 = xmlLinkGetData(lk), iVar3 = 0, pvVar4 != (void *)0x0)) {
    iVar1 = 0;
    iVar3 = 0;
    switch(*(undefined4 *)((long)pvVar4 + 8)) {
    case 0:
    case 3:
    case 4:
    case 5:
      break;
    case 2:
      iVar1 = xmlTextWriterEndAttribute(writer);
      if (iVar1 < 0) {
        return -1;
      }
    case 1:
      iVar2 = xmlTextWriterOutputNSDecl(writer);
      if (iVar2 < 0) {
        return -1;
      }
      iVar3 = xmlOutputBufferWriteString(writer->out,">");
      if (iVar3 < 0) {
        return -1;
      }
      iVar3 = iVar2 + iVar1 + iVar3;
      *(undefined4 *)((long)pvVar4 + 8) = 3;
      break;
    case 6:
      msg = "xmlTextWriterStartCDATA : CDATA not allowed in this context!\n";
      error = XML_ERR_INTERNAL_ERROR;
      goto LAB_001b9f36;
    default:
      goto switchD_001b9edb_default;
    }
  }
  data = (undefined8 *)(*xmlMalloc)(0x10);
  if (data == (undefined8 *)0x0) {
    msg = "xmlTextWriterStartCDATA : out of memory!\n";
    error = XML_ERR_NO_MEMORY;
LAB_001b9f36:
    xmlWriterErrMsg(writer,error,msg);
  }
  else {
    *data = 0;
    *(undefined4 *)(data + 1) = 6;
    xmlListPushFront(writer->nodes,data);
    iVar1 = xmlOutputBufferWriteString(writer->out,"<![CDATA[");
    iVar5 = -1;
    if (-1 < iVar1) {
      iVar5 = iVar3 + iVar1;
    }
  }
switchD_001b9edb_default:
  return iVar5;
}

Assistant:

int
xmlTextWriterStartCDATA(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL)
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            switch (p->state) {
                case XML_TEXTWRITER_NONE:
		case XML_TEXTWRITER_TEXT:
                case XML_TEXTWRITER_PI:
                case XML_TEXTWRITER_PI_TEXT:
                    break;
                case XML_TEXTWRITER_ATTRIBUTE:
                    count = xmlTextWriterEndAttribute(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    /* fallthrough */
                case XML_TEXTWRITER_NAME:
                    /* Output namespace declarations */
                    count = xmlTextWriterOutputNSDecl(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    count = xmlOutputBufferWriteString(writer->out, ">");
                    if (count < 0)
                        return -1;
                    sum += count;
                    p->state = XML_TEXTWRITER_TEXT;
                    break;
                case XML_TEXTWRITER_CDATA:
                    xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                                    "xmlTextWriterStartCDATA : CDATA not allowed in this context!\n");
                    return -1;
                default:
                    return -1;
            }
        }
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartCDATA : out of memory!\n");
        return -1;
    }

    p->name = NULL;
    p->state = XML_TEXTWRITER_CDATA;

    xmlListPushFront(writer->nodes, p);

    count = xmlOutputBufferWriteString(writer->out, "<![CDATA[");
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}